

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O2

void yyPush(GREG *G,char *text,int count,yythunk *thunk,void *yyxvar)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  ulong uVar4;
  
  uVar4 = ((long)G->val - (long)G->vals >> 2) + (long)count;
  uVar2 = (ulong)G->valslen;
  if (uVar2 < uVar4) {
    while( true ) {
      iVar1 = (int)uVar2;
      if (uVar4 + 1 <= (ulong)(long)iVar1) break;
      uVar2 = (ulong)(uint)(iVar1 * 2);
      G->valslen = iVar1 * 2;
    }
    piVar3 = (int *)realloc(G->vals,(long)iVar1 << 2);
    G->vals = piVar3;
    piVar3 = piVar3 + uVar4;
  }
  else {
    piVar3 = G->val + count;
  }
  G->val = piVar3;
  return;
}

Assistant:

YY_LOCAL(void) yyPush(GREG *G, char *text, int count, yythunk *thunk, YY_XTYPE YY_XVAR)	{
  size_t off = (G->val - G->vals) + count;
  if (off > G->valslen) {
    while (G->valslen < off + 1)
      G->valslen *= 2;
    G->vals= (YYSTYPE*)YY_REALLOC((void *)G->vals, sizeof(YYSTYPE) * G->valslen, G->data);
    G->val= G->vals + off;
  } else {
    G->val += count;
  }
}